

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::MarkForClose(ScriptContext *this)

{
  int iVar1;
  
  iVar1 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((char)iVar1 != '\0') {
    return;
  }
  SaveStartupProfileAndRelease(this,false);
  SetIsClosed(this);
  if (this->isRootTrackerScriptContext == true) {
    ThreadContext::ClearRootTrackerScriptContext(this->threadContext,this);
  }
  if (this->threadContext->callRootLevel != 0) {
    ThreadContext::AddToPendingScriptContextCloseList(this->threadContext,this);
    return;
  }
  Close(this,false);
  return;
}

Assistant:

void ScriptContext::MarkForClose()
    {
        if (IsClosed())
        {
            return;
        }

        SaveStartupProfileAndRelease(true);
        SetIsClosed();

#ifdef LEAK_REPORT
        if (this->isRootTrackerScriptContext)
        {
            this->GetThreadContext()->ClearRootTrackerScriptContext(this);
        }
#endif

        if (!threadContext->IsInScript())
        {
            Close(FALSE);
        }
        else
        {
            threadContext->AddToPendingScriptContextCloseList(this);
        }
    }